

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

int __thiscall HModel::load_fromToy(HModel *this,char *filename)

{
  int *m_p;
  int *n_p;
  vector<int,_std::allocator<int>_> *this_00;
  double dVar1;
  uint uVar2;
  char *pcVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  int iVar9;
  double *pdVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  double *A;
  vector<double,_std::allocator<double>_> *local_78;
  vector<double,_std::allocator<double>_> *local_70;
  int *intColumn;
  double *ub;
  double *lb;
  double *c;
  double *b;
  timeval local_40;
  
  clearModel(this);
  this->totalTime = 0.0;
  HTimer::reset(&this->timer);
  pcVar3 = (char *)(this->modelName)._M_string_length;
  strlen(filename);
  uVar16 = 0;
  std::__cxx11::string::_M_replace((ulong)&this->modelName,0,pcVar3,(ulong)filename);
  m_p = &this->numRow;
  n_p = &this->numCol;
  iVar9 = readToy_MIP_cpp(filename,m_p,n_p,&this->objSense,&this->objOffset,&A,&b,&c,&lb,&ub,
                          &intColumn);
  if (iVar9 == 0) {
    printf("Model has %3d rows and %3d cols\n",(ulong)(uint)*m_p,(ulong)(uint)*n_p);
    printf("Model has Objective sense is %d; Objective offset is %g\n",this->objOffset,
           (ulong)(uint)this->objSense);
    if (0 < (long)*n_p) {
      uVar2 = *m_p;
      lVar12 = 0;
      uVar16 = 0;
      pdVar10 = A;
      do {
        if (0 < (int)uVar2) {
          uVar13 = 0;
          do {
            uVar16 = uVar16 + (pdVar10[uVar13] != 0.0);
            uVar13 = uVar13 + 1;
          } while (uVar2 != uVar13);
        }
        lVar12 = lVar12 + 1;
        pdVar10 = pdVar10 + uVar2;
      } while (lVar12 != *n_p);
    }
    printf("Model has %d nonzeros\n",(ulong)uVar16);
    std::ostream::flush();
    std::vector<int,_std::allocator<int>_>::resize(&this->Astart,(long)this->numCol + 1);
    std::vector<int,_std::allocator<int>_>::resize(&this->Aindex,(long)(int)uVar16);
    std::vector<double,_std::allocator<double>_>::resize(&this->Avalue,(long)(int)uVar16);
    piVar4 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    *piVar4 = 0;
    if (0 < this->numCol) {
      lVar12 = 0;
      do {
        iVar11 = piVar4[lVar12];
        iVar15 = *m_p;
        if (0 < iVar15) {
          piVar5 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar14 = 0;
          do {
            dVar1 = A[iVar15 * (int)lVar12 + lVar14];
            if ((dVar1 != 0.0) || (NAN(dVar1))) {
              piVar5[iVar11] = (int)lVar14;
              pdVar6[iVar11] = dVar1;
              iVar11 = iVar11 + 1;
            }
            iVar15 = *m_p;
            lVar14 = lVar14 + 1;
          } while ((int)lVar14 < iVar15);
        }
        piVar4[lVar12 + 1] = iVar11;
        lVar12 = lVar12 + 1;
      } while (lVar12 < *n_p);
    }
    puts("Model has sparse matrix");
    std::ostream::flush();
    std::vector<double,_std::allocator<double>_>::resize(&this->colCost,(long)this->numCol);
    std::vector<double,_std::allocator<double>_>::resize(&this->colLower,(long)this->numCol);
    std::vector<double,_std::allocator<double>_>::resize(&this->colUpper,(long)this->numCol);
    this_00 = &this->integerColumn;
    std::vector<int,_std::allocator<int>_>::resize(this_00,(long)this->numCol);
    local_70 = &this->rowLower;
    std::vector<double,_std::allocator<double>_>::resize(local_70,(long)this->numRow);
    local_78 = &this->rowUpper;
    std::vector<double,_std::allocator<double>_>::resize(local_78,(long)this->numRow);
    if (0 < this->numCol) {
      pdVar6 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar12 = 0;
      do {
        pdVar6[lVar12] = c[lVar12];
        pdVar7[lVar12] = lb[lVar12];
        pdVar8[lVar12] = ub[lVar12];
        piVar4[lVar12] = intColumn[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 < *n_p);
    }
    puts("Model has column data");
    std::ostream::flush();
    iVar11 = *m_p;
    if (0 < (long)iVar11) {
      pdVar6 = (local_70->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (local_78->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar12 = 0;
      do {
        pdVar6[lVar12] = b[lVar12];
        pdVar7[lVar12] = b[lVar12];
        lVar12 = lVar12 + 1;
      } while (iVar11 != lVar12);
    }
    if ((long)*n_p < 1) {
      iVar11 = 0;
    }
    else {
      lVar12 = 0;
      iVar11 = 0;
      do {
        iVar11 = (iVar11 + 1) -
                 (uint)((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar12] == 0);
        lVar12 = lVar12 + 1;
      } while (*n_p != lVar12);
    }
    if (iVar11 != 0) {
      printf("MPS file has %d integer variables\n");
    }
    this->numTot = this->numRow + this->numCol;
    initScale(this);
    initWithLogicalBasis(this);
  }
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  this->totalTime =
       (((double)local_40.tv_usec / 1000000.0 + (double)local_40.tv_sec) - (this->timer).startTime)
       + this->totalTime;
  return iVar9;
}

Assistant:

int HModel::load_fromToy(const char *filename) {
  //  int m, n, maxmin;
  //double offset;
  double *A, *b, * c, *lb, *ub;
  int *intColumn;
  // Remove any current model
  clearModel();
  
  // Initialise the total runtine for this model
  totalTime = 0;

  // Load the model, timing the process
  timer.reset();
  modelName = filename;

  int RtCd = readToy_MIP_cpp(filename, &numRow, &numCol, &objSense, &objOffset,
			     &A,
			     &b, &c, &lb, &ub,
			     &intColumn);
  if (RtCd) {
    totalTime += timer.getTime();
    return RtCd;
  }
  printf("Model has %3d rows and %3d cols\n", numRow, numCol);
  printf("Model has Objective sense is %d; Objective offset is %g\n", objSense, objOffset);
  int numNz = 0;
  for (int c_n = 0; c_n<numCol; c_n++) {
    for (int r_n = 0; r_n<numRow; r_n++) {
      double r_v = A[r_n+c_n*numRow];
      if (r_v != 0) numNz++;
    }
  }
  printf("Model has %d nonzeros\n", numNz);cout<<flush;
  Astart.resize(numCol+1);
  Aindex.resize(numNz);
  Avalue.resize(numNz);
  Astart[0] = 0;
  for (int c_n = 0; c_n<numCol; c_n++) {
    int el_n = Astart[c_n];
    for (int r_n = 0; r_n<numRow; r_n++) {
      double r_v = A[r_n+c_n*numRow];
      if (r_v != 0) {
  	Aindex[el_n] = r_n;
  	Avalue[el_n] = r_v;
  	el_n++;
      }
    }
    Astart[c_n+1] = el_n;
  }
  printf("Model has sparse matrix\n");cout<<flush;
  colCost.resize(numCol);
  colLower.resize(numCol);
  colUpper.resize(numCol);
  integerColumn.resize(numCol);
  rowLower.resize(numRow);
  rowUpper.resize(numRow);

  for (int c_n = 0; c_n<numCol; c_n++) {
    colCost[c_n] = c[c_n];
    colLower[c_n] = lb[c_n];
    colUpper[c_n] = ub[c_n];
    integerColumn[c_n] = intColumn[c_n];
  }
  printf("Model has column data\n");cout<<flush;
  for (int r_n = 0; r_n<numRow; r_n++) {
    rowLower[r_n] = b[r_n];
    rowUpper[r_n] = b[r_n];
  }  
#ifdef JAJH_dev
  int numIntegerColumn = 0;
  for (int c_n=0; c_n<numCol; c_n++) {
    if (integerColumn[c_n]) numIntegerColumn++;
  }
  if (numIntegerColumn) printf("MPS file has %d integer variables\n", numIntegerColumn);
#endif
 
  numTot = numCol + numRow;

#ifdef JAJH_dev
  //Use this next line to check the loading of a model from arrays
  //check_load_fromArrays(); return;
#endif

  // Assign and initialise the scaling factors
  initScale();
  
  // Initialise with a logical basis then allocate and populate (where
  // possible) work* arrays and allocate basis* arrays
  initWithLogicalBasis();

  totalTime += timer.getTime();
  return RtCd;
}